

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Free(Extension *this)

{
  int iVar1;
  Arena *pAVar2;
  string *this_00;
  
  iVar1 = *(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4);
  if (this->is_repeated == true) {
    switch(iVar1) {
    case 1:
    case 8:
      this_00 = (string *)(this->field_0).repeated_int32_value;
      if (this_00 != (string *)0x0) {
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_00);
LAB_002c678c:
        operator_delete(this_00);
        return;
      }
      break;
    case 2:
      this_00 = (string *)(this->field_0).repeated_int64_value;
      if (this_00 != (string *)0x0) {
        RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_00);
        goto LAB_002c678c;
      }
      break;
    case 3:
      this_00 = (string *)(this->field_0).repeated_uint32_value;
      if (this_00 != (string *)0x0) {
        RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_00);
        goto LAB_002c678c;
      }
      break;
    case 4:
      this_00 = (string *)(this->field_0).repeated_uint64_value;
      if (this_00 != (string *)0x0) {
        RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_00);
        goto LAB_002c678c;
      }
      break;
    case 5:
      this_00 = (string *)(this->field_0).repeated_double_value;
      if (this_00 != (string *)0x0) {
        RepeatedField<double>::~RepeatedField((RepeatedField<double> *)this_00);
        goto LAB_002c678c;
      }
      break;
    case 6:
      this_00 = (string *)(this->field_0).repeated_float_value;
      if (this_00 != (string *)0x0) {
        RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_00);
        goto LAB_002c678c;
      }
      break;
    case 7:
      this_00 = (string *)(this->field_0).repeated_bool_value;
      if (this_00 != (string *)0x0) {
        RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_00);
        goto LAB_002c678c;
      }
      break;
    case 9:
      this_00 = (string *)(this->field_0).repeated_string_value;
      if (this_00 != (string *)0x0) {
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)this_00);
        goto LAB_002c678c;
      }
      break;
    case 10:
      this_00 = (this->field_0).string_value;
      if (this_00 != (string *)0x0) {
        RepeatedPtrFieldBase::
        Destroy<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                  ((RepeatedPtrFieldBase *)this_00);
        goto LAB_002c678c;
      }
    }
  }
  else if (iVar1 == 10) {
    if ((this->field_0).repeated_string_value !=
        (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0) {
      (*(code *)(((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)->
                impl_).hint_._M_b._M_p)();
      return;
    }
  }
  else if ((iVar1 == 9) &&
          (this_00 = (string *)(this->field_0).repeated_string_value, this_00 != (string *)0x0)) {
    pAVar2 = (Arena *)(this_00->_M_dataplus)._M_p;
    if (pAVar2 != (Arena *)&this_00->field_2) {
      operator_delete(pAVar2);
    }
    goto LAB_002c678c;
  }
  return;
}

Assistant:

void ExtensionSet::Extension::Free() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    delete repeated_##LOWERCASE##_value;    \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    switch (cpp_type(type)) {
      case WireFormatLite::CPPTYPE_STRING:
        delete string_value;
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_lazy) {
          delete lazymessage_value;
        } else {
          delete message_value;
        }
        break;
      default:
        break;
    }
  }
}